

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiIniData * AddWindowSettings(char *name)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  ImGuiIniData *pIVar4;
  ImGuiContext *pIVar5;
  ImU32 IVar6;
  ImGuiIniData *__dest;
  long lVar7;
  size_t sVar8;
  char *__dest_00;
  int iVar9;
  
  pIVar5 = GImGui;
  iVar9 = (GImGui->Settings).Size;
  iVar3 = (GImGui->Settings).Capacity;
  iVar1 = iVar9 + 1;
  if (iVar3 <= iVar9) {
    if (iVar3 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar3 / 2 + iVar3;
    }
    if (iVar9 <= iVar1) {
      iVar9 = iVar1;
    }
    if (iVar3 < iVar9) {
      piVar2 = &(GImGui->IO).MetricsAllocs;
      *piVar2 = *piVar2 + 1;
      __dest = (ImGuiIniData *)(*(pIVar5->IO).MemAllocFn)((long)iVar9 << 5);
      pIVar4 = (pIVar5->Settings).Data;
      if (pIVar4 != (ImGuiIniData *)0x0) {
        memcpy(__dest,pIVar4,(long)(pIVar5->Settings).Size << 5);
      }
      pIVar4 = (pIVar5->Settings).Data;
      if (pIVar4 != (ImGuiIniData *)0x0) {
        piVar2 = &(GImGui->IO).MetricsAllocs;
        *piVar2 = *piVar2 + -1;
      }
      (*(GImGui->IO).MemFreeFn)(pIVar4);
      (pIVar5->Settings).Data = __dest;
      (pIVar5->Settings).Capacity = iVar9;
    }
  }
  (pIVar5->Settings).Size = iVar1;
  pIVar5 = GImGui;
  lVar7 = (long)(GImGui->Settings).Size;
  if (0 < lVar7) {
    pIVar4 = (GImGui->Settings).Data;
    sVar8 = strlen(name);
    piVar2 = &(pIVar5->IO).MetricsAllocs;
    *piVar2 = *piVar2 + 1;
    __dest_00 = (char *)(*(pIVar5->IO).MemAllocFn)(sVar8 + 1);
    memcpy(__dest_00,name,sVar8 + 1);
    pIVar4[lVar7 + -1].Name = __dest_00;
    IVar6 = ImHash(name,0,0);
    pIVar4[lVar7 + -1].Id = IVar6;
    pIVar4[lVar7 + -1].Collapsed = false;
    pIVar4[lVar7 + -1].Pos.x = 3.4028235e+38;
    pIVar4[lVar7 + -1].Pos.y = 3.4028235e+38;
    pIVar4[lVar7 + -1].Size.x = 0.0;
    pIVar4[lVar7 + -1].Size.y = 0.0;
    return pIVar4 + lVar7 + -1;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                ,0x35d,"value_type &ImVector<ImGuiIniData>::back() [T = ImGuiIniData]");
}

Assistant:

static ImGuiIniData* AddWindowSettings(const char* name)
{
    GImGui->Settings.resize(GImGui->Settings.Size + 1);
    ImGuiIniData* ini = &GImGui->Settings.back();
    ini->Name = ImStrdup(name);
    ini->Id = ImHash(name, 0);
    ini->Collapsed = false;
    ini->Pos = ImVec2(FLT_MAX,FLT_MAX);
    ini->Size = ImVec2(0,0);
    return ini;
}